

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.c
# Opt level: O2

languageDefinition * prvTidytidyTestLanguage(ctmbstr languageCode)

{
  languageDefinition *plVar1;
  int iVar2;
  ulong uVar3;
  
  uVar3 = 0;
  do {
    plVar1 = tidyLanguages.languages[uVar3];
    if (plVar1 == (languageDefinition *)0x0) {
      return (languageDefinition *)0x0;
    }
    iVar2 = strcmp(plVar1->messages[0].value,languageCode);
    uVar3 = (ulong)((int)uVar3 + 1);
  } while (iVar2 != 0);
  return plVar1;
}

Assistant:

languageDefinition *TY_(tidyTestLanguage)( ctmbstr languageCode )
{
    uint i;
    languageDefinition *testLang;
    languageDictionary *testDict;
    ctmbstr testCode;
    
    for (i = 0; tidyLanguages.languages[i]; ++i)
    {
        testLang = tidyLanguages.languages[i];
        testDict = &testLang->messages;
        testCode = (*testDict)[0].value;
        
        if ( strcmp(testCode, languageCode) == 0 )
            return testLang;
    }
    
    return NULL;
}